

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warnless.c
# Opt level: O2

ssize_t curlx_uztosz(size_t uznum)

{
  return uznum & 0x7fffffffffffffff;
}

Assistant:

ssize_t curlx_uztosz(size_t uznum)
{
#ifdef __INTEL_COMPILER
#  pragma warning(push)
#  pragma warning(disable:810) /* conversion may lose significant bits */
#endif

  DEBUGASSERT(uznum <= (size_t) CURL_MASK_SSIZE_T);
  return (ssize_t)(uznum & (size_t) CURL_MASK_SSIZE_T);

#ifdef __INTEL_COMPILER
#  pragma warning(pop)
#endif
}